

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

wally_psbt * cfd::core::ParsePsbtData(ByteData *data)

{
  bool bVar1;
  undefined8 key;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pTVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  CfdException *pCVar8;
  size_t key_len;
  _func_int **pp_Var9;
  wally_psbt_output *output;
  ulong uVar10;
  wally_psbt *pwVar11;
  int ret;
  wally_psbt *psbt;
  uint8_t magic [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  Deserializer parser;
  size_t tmp_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  wally_tx tx;
  int local_1ec;
  wally_psbt *local_1e8;
  int local_1e0;
  uchar local_1dc;
  undefined1 local_1d8 [32];
  uchar *local_1b8;
  size_t sStack_1b0;
  uchar *local_1a8;
  size_t sStack_1a0;
  uchar *local_198;
  size_t sStack_190;
  uchar *local_188;
  size_t sStack_180;
  uchar *local_178;
  size_t sStack_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  undefined1 local_130 [8];
  int local_128;
  char *local_120 [2];
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_110;
  ulong local_f8;
  Deserializer local_f0;
  Transaction local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  wally_tx local_68;
  
  local_1e8 = (wally_psbt *)0x0;
  ByteData::GetBytes(&local_160,data);
  local_1ec = wally_psbt_from_bytes
                        (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_160.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_160.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&local_1e8);
  pwVar11 = local_1e8;
  if (local_1ec != -2) {
    if (local_1ec != 0) {
      local_1d8._0_8_ = "cfdcore_psbt.cpp";
      local_1d8._8_4_ = 0x650;
      local_1d8._16_8_ = "ParsePsbtData";
      logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                        "wally_psbt_from_bytes NG[{}]",&local_1ec);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1d8._0_8_ = local_1d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"psbt from bytes error.","");
      CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    iVar5 = 0;
    if ((local_1e8->num_inputs != 0) || (local_1e8->num_outputs != 0)) goto LAB_00454b37;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
               (long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&local_c8);
    local_c8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x0;
    local_1ec = wally_psbt_to_bytes(local_1e8,0,(uchar *)local_1d8._0_8_,
                                    local_1d8._8_8_ - local_1d8._0_8_,(size_t *)&local_c8);
    if ((local_1ec == 0) &&
       (local_c8.super_AbstractTransaction._vptr_AbstractTransaction ==
        (_func_int **)
        (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish +
        -(long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start))) {
      bVar1 = false;
      pwVar11 = local_1e8;
    }
    else {
      wally_psbt_free(local_1e8);
      local_1e8 = (wally_psbt *)0x0;
      bVar1 = true;
    }
    if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_1d8._0_8_);
    }
    iVar5 = local_1ec;
    if (!bVar1) goto LAB_00454b37;
  }
  Deserializer::Deserializer(&local_f0,data);
  local_1dc = '\0';
  local_1e0 = 0;
  if (5 < (ulong)((long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    Deserializer::ReadArray(&local_f0,(uint8_t *)&local_1e0,5);
  }
  if (local_1dc != 0xff || local_1e0 != 0x74627370) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x659;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt unmatch magic.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"psbt unmatch magic error.","");
    CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1ec = wally_psbt_init_alloc(0,0,0,0,&local_1e8);
  if (local_1ec != 0) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x65e;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                      "wally_psbt_init_alloc NG[{}]",&local_1ec);
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"psbt alloc error.","");
    CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1e8->magic[4] = local_1dc;
  *(int *)local_1e8->magic = local_1e0;
  local_1ec = 0;
  pp_Var9 = (_func_int **)0x0;
  do {
    Deserializer::ReadVariableBuffer
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,&local_f0);
    uVar2 = local_1d8._8_8_;
    key = local_1d8._0_8_;
    local_1d8._0_8_ = (_func_int **)0x0;
    local_1d8._8_8_ = (_func_int **)0x0;
    local_1d8._16_8_ = (pointer)0x0;
    if (pp_Var9 != (_func_int **)0x0) {
      operator_delete(pp_Var9);
    }
    if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (key == uVar2) break;
    Deserializer::ReadVariableBuffer(&local_148,&local_f0);
    key_len = uVar2 - key;
    if (*(uchar *)key == 0xfb) {
      if (key_len != 1) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x698;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt invalid key format.")
        ;
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt invalid key format error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_1e8->version != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x69d;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt version duplicates.")
        ;
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt version duplicates error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 4) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x6a2;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt invlid version size."
                     );
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt invlid version size error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      uVar6 = *(uint32_t *)
               local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1e8->version = uVar6;
      if (uVar6 != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x6a9;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<unsigned_int&>
                  ((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt unsupported version[{}]"
                   ,&local_1e8->version);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt unsupported version error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else if (*(uchar *)key == '\0') {
      if (key_len != 1) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x66d;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt invalid key format.")
        ;
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt invalid key format error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_1e8->tx != (wally_tx *)0x0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x672;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"global tx duplicates.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt global tx duplicates error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::ByteData((ByteData *)local_1d8,&local_148);
      Transaction::Transaction(&local_c8,(ByteData *)local_1d8);
      if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1d8._0_8_);
      }
      uVar6 = Transaction::GetTxInCount(&local_c8);
      if (uVar6 != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x67a;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt format error.");
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt format error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Transaction::GetTxOutList(&local_110,&local_c8);
      local_68.outputs = (wally_tx_output *)0x0;
      local_68.num_outputs = 0;
      local_68.num_inputs = 0;
      local_68.inputs_allocation_len = 0;
      local_68.version = 0;
      local_68.locktime = 0;
      local_68.inputs = (wally_tx_input *)0x0;
      local_68.outputs_allocation_len = 0;
      uVar6 = AbstractTransaction::GetVersion(&local_c8.super_AbstractTransaction);
      local_68.version = uVar6;
      uVar6 = AbstractTransaction::GetLockTime(&local_c8.super_AbstractTransaction);
      local_68.locktime = uVar6;
      local_1ec = wally_psbt_set_global_tx(local_1e8,&local_68);
      if (local_1ec != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x684;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                          "wally_psbt_set_global_tx NG[{}]",&local_1ec);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt set tx error.","");
        CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_1ec = 0;
      if (local_110.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_110.
          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar10 = 0;
        local_1ec = 0;
        do {
          pTVar4 = local_110.
                   super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          Script::Script((Script *)local_1d8,
                         &local_110.
                          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar10].
                          super_AbstractTxOutReference.locking_script_);
          Script::GetData((ByteData *)local_130,(Script *)local_1d8);
          ByteData::GetBytes(&local_80,(ByteData *)local_130);
          if (local_130 != (undefined1  [8])0x0) {
            operator_delete((void *)local_130);
          }
          Script::~Script((Script *)local_1d8);
          local_178 = (uchar *)0x0;
          sStack_170 = 0;
          local_188 = (uchar *)0x0;
          sStack_180 = 0;
          local_198 = (uchar *)0x0;
          sStack_190 = 0;
          local_1a8 = (uchar *)0x0;
          sStack_1a0 = 0;
          local_1b8 = (uchar *)0x0;
          sStack_1b0 = 0;
          local_1d8._16_8_ = (pointer)0x0;
          local_1d8._24_8_ = 0;
          local_1d8._0_8_ = (pointer)0x0;
          local_1d8._8_8_ = (pointer)0x0;
          local_130 = (undefined1  [8])pTVar4[uVar10].super_AbstractTxOutReference.value_.amount_;
          local_128 = CONCAT31(local_128._1_3_,
                               pTVar4[uVar10].super_AbstractTxOutReference.value_.ignore_check_);
          local_1d8._0_8_ = Amount::GetSatoshiValue((Amount *)local_130);
          local_1d8._8_8_ =
               local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1d8._16_8_ =
               local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               -(long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          local_1ec = wally_psbt_add_output_at
                                (local_1e8,(uint32_t)uVar10,0,(wally_tx_output *)local_1d8);
          if (local_1ec != 0) {
            local_130 = (undefined1  [8])0x59b33e;
            local_128 = 0x692;
            local_120[0] = "ParsePsbtData";
            logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                              "wally_psbt_add_output_at NG[{}]",&local_1ec);
            pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
            local_130 = (undefined1  [8])local_120;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_130,"psbt set txout error.","");
            CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_130);
            __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if ((_func_int **)
              local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (_func_int **)0x0) {
            operator_delete(local_80.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar10 = (ulong)((uint32_t)uVar10 + 1);
          uVar7 = ((long)local_110.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_110.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                (&local_110);
      Transaction::~Transaction(&local_c8);
    }
    else {
      local_1ec = wally_map_add(&local_1e8->unknowns,(uchar *)key,key_len,
                                local_148.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (local_1ec != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x6b1;
        local_1d8._16_8_ = "ParsePsbtData";
        logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                          &local_1ec);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt add unknowns error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    if ((uint32_t *)
        local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint32_t *)0x0) {
      operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    pp_Var9 = (_func_int **)key;
  } while (key != uVar2);
  if (local_1e8->tx == (wally_tx *)0x0) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x6ba;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt global tx not found.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"psbt global tx not found error.","");
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1ec = wally_map_sort(&local_1e8->unknowns,0);
  if (local_1ec != 0) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x6c1;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                      &local_1ec);
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"psbt sort unknowns error.","");
    CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_1e8->tx->num_inputs != 0) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x6c6;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,
                  "psbt exist input. please use libwally-core.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"psbt exist input.","");
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_1ec = 0;
  if (local_1e8->tx->num_outputs != 0) {
    uVar10 = 0;
    do {
      output = local_1e8->outputs + uVar10;
      local_c8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x0;
      local_c8.super_AbstractTransaction.wally_tx_pointer_ = (_func_int **)0x0;
      local_c8.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pp_Var9 = (_func_int **)0x0;
      local_f8 = uVar10;
      while( true ) {
        Deserializer::ReadVariableBuffer
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,&local_f0);
        uVar3 = local_1d8._8_8_;
        uVar2 = local_1d8._0_8_;
        local_c8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)local_1d8._0_8_
        ;
        local_c8.super_AbstractTransaction.wally_tx_pointer_ = (void *)local_1d8._8_8_;
        local_c8.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1d8._16_8_;
        local_1d8._0_8_ = (_func_int **)0x0;
        local_1d8._8_8_ = (_func_int **)0x0;
        local_1d8._16_8_ = (pointer)0x0;
        if (pp_Var9 != (_func_int **)0x0) {
          operator_delete(pp_Var9);
        }
        if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_1d8._0_8_);
        }
        if (uVar2 == uVar3) break;
        Deserializer::ReadVariableBuffer
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,&local_f0);
        SetPsbtOutput((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,output);
        pp_Var9 = (_func_int **)uVar2;
        if ((_func_int **)local_1d8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_1d8._0_8_);
        }
      }
      uVar6 = wally_map_sort(&output->keypaths,0);
      local_68.version = uVar6;
      if (uVar6 != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x62b;
        local_1d8._16_8_ = "ParsePsbtOutput";
        logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"wally_map_sort NG[{}]"
                          ,(int *)&local_68);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt output sort keypaths error.","");
        CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_68.version = wally_map_sort(&output->unknowns,0);
      uVar10 = local_f8;
      if (local_68.version != 0) {
        local_1d8._0_8_ = "cfdcore_psbt.cpp";
        local_1d8._8_4_ = 0x631;
        local_1d8._16_8_ = "ParsePsbtOutput";
        logger::log<int&>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"wally_map_sort NG[{}]"
                          ,(int *)&local_68);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1d8._0_8_ = local_1d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"psbt output sort unknowns error.","");
        CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_1d8);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if ((_func_int **)uVar2 != (_func_int **)0x0) {
        operator_delete((void *)uVar2);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_1e8->tx->num_outputs);
  }
  uVar6 = Deserializer::GetReadSize(&local_f0);
  pwVar11 = local_1e8;
  if ((long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (ulong)uVar6) {
    local_1d8._0_8_ = "cfdcore_psbt.cpp";
    local_1d8._8_4_ = 0x6d0;
    local_1d8._16_8_ = "ParsePsbtData";
    logger::log<>((CfdSourceLocation *)local_1d8,kCfdLogLevelWarning,"psbt analyze error.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"psbt analyze error.","");
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_1d8);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((_func_int **)key != (_func_int **)0x0) {
    operator_delete((void *)key);
  }
  local_f0._vptr_Deserializer = (_func_int **)&PTR__Deserializer_0068f908;
  iVar5 = local_1ec;
  if (local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar5 = local_1ec;
  }
LAB_00454b37:
  local_1ec = iVar5;
  if (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pwVar11;
}

Assistant:

struct wally_psbt *ParsePsbtData(const ByteData &data) {
  static const uint8_t kPsbtMagic[] = {'p', 's', 'b', 't', 0xff};

  struct wally_psbt *psbt = nullptr;
  std::vector<uint8_t> bytes = data.GetBytes();
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &psbt);
  if (ret == WALLY_OK) {
    if ((psbt->num_inputs != 0) || (psbt->num_outputs != 0)) {
      return psbt;
    }
    std::vector<uint8_t> tmp_buf(bytes.size());
    size_t tmp_size = 0;
    ret = wally_psbt_to_bytes(
        psbt, 0, tmp_buf.data(), tmp_buf.size(), &tmp_size);
    if ((ret == WALLY_OK) && (tmp_size == bytes.size())) {
      // It was able to convert the data correctly.
      return psbt;
    }
    wally_psbt_free(psbt);
    psbt = nullptr;
  } else if (ret != WALLY_EINVAL) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  Deserializer parser(data);
  uint8_t magic[sizeof(kPsbtMagic)];
  memset(magic, 0, sizeof(magic));
  if (bytes.size() > 5) parser.ReadArray(magic, sizeof(magic));
  if (memcmp(magic, kPsbtMagic, sizeof(magic)) != 0) {
    warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
    throw CfdException(kCfdInternalError, "psbt unmatch magic error.");
  }
  ret = wally_psbt_init_alloc(0, 0, 0, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt alloc error.");
  }

  try {
    memcpy(psbt->magic, magic, sizeof(psbt->magic));

    std::vector<uint8_t> key;
    do {
      key = parser.ReadVariableBuffer();
      if (!key.empty()) {
        std::vector<uint8_t> buf = parser.ReadVariableBuffer();
        bool has_key_1byte = (key.size() == 1);
        if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->tx != nullptr) {
            warn(CFD_LOG_SOURCE, "global tx duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt global tx duplicates error.");
          }

          Transaction transaction(buf);
          if (transaction.GetTxInCount() != 0) {
            // failed to psbt format check on libwally-core.
            warn(CFD_LOG_SOURCE, "psbt format error.");
            throw CfdException(kCfdIllegalArgumentError, "psbt format error.");
          }
          auto txouts = transaction.GetTxOutList();
          struct wally_tx tx;
          memset(&tx, 0, sizeof(tx));
          tx.version = transaction.GetVersion();
          tx.locktime = transaction.GetLockTime();
          ret = wally_psbt_set_global_tx(psbt, &tx);
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
            throw CfdException(kCfdInternalError, "psbt set tx error.");
          }
          for (uint32_t index = 0; index < txouts.size(); ++index) {
            const auto &txout = txouts[index];
            auto script_val = txout.GetLockingScript().GetData().GetBytes();
            struct wally_tx_output output;
            memset(&output, 0, sizeof(output));
            output.satoshi =
                static_cast<uint64_t>(txout.GetValue().GetSatoshiValue());
            output.script = script_val.data();
            output.script_len = script_val.size();
            ret = wally_psbt_add_output_at(psbt, index, 0, &output);
            if (ret != WALLY_OK) {
              warn(CFD_LOG_SOURCE, "wally_psbt_add_output_at NG[{}]", ret);
              throw CfdException(kCfdInternalError, "psbt set txout error.");
            }
          }
        } else if (key[0] == Psbt::kPsbtGlobalVersion) {
          if (!has_key_1byte) {
            warn(CFD_LOG_SOURCE, "psbt invalid key format.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invalid key format error.");
          }
          if (psbt->version > 0) {
            warn(CFD_LOG_SOURCE, "psbt version duplicates.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt version duplicates error.");
          }
          if (buf.size() != sizeof(psbt->version)) {
            warn(CFD_LOG_SOURCE, "psbt invlid version size.");
            throw CfdException(
                kCfdIllegalArgumentError, "psbt invlid version size error.");
          }
          memcpy(&psbt->version, buf.data(), sizeof(psbt->version));
          if (psbt->version > Psbt::GetDefaultVersion()) {
            warn(
                CFD_LOG_SOURCE, "psbt unsupported version[{}]", psbt->version);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt unsupported version error.");
          }
        } else {
          ret = wally_map_add(
              &psbt->unknowns, key.data(), key.size(), buf.data(), buf.size());
          if (ret != WALLY_OK) {
            warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
            throw CfdException(
                kCfdIllegalArgumentError, "psbt add unknowns error.");
          }
        }
      }
    } while (!key.empty());

    if (psbt->tx == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt global tx not found.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt global tx not found error.");
    }

    ret = wally_map_sort(&psbt->unknowns, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
    }

    if (psbt->tx->num_inputs != 0) {
      warn(CFD_LOG_SOURCE, "psbt exist input. please use libwally-core.");
      throw CfdException(kCfdIllegalArgumentError, "psbt exist input.");
    }

    for (size_t i = 0; i < psbt->tx->num_outputs; ++i) {
      ParsePsbtOutput(&parser, &psbt->outputs[i]);
    }

    uint32_t offset = parser.GetReadSize();
    if (bytes.size() != offset) {
      warn(CFD_LOG_SOURCE, "psbt analyze error.");
      throw CfdException(kCfdIllegalArgumentError, "psbt analyze error.");
    }
    return psbt;
  } catch (const CfdError &except) {
    wally_psbt_free(psbt);
    throw except;
  } catch (const std::exception &except) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    wally_psbt_free(psbt);
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}